

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

void __thiscall
cnn::Tensor::save<boost::archive::text_oarchive>(Tensor *this,text_oarchive *ar,uint param_2)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  float *t;
  ulong uVar9;
  ushort uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  int iVar18;
  
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::Dim>_>::
  get_instance();
  boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)this);
  uVar9 = (ulong)(this->d).nd;
  if (uVar9 == 0) {
    iVar18 = 1;
  }
  else {
    auVar12 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpbroadcastq_avx512f();
    uVar8 = 0;
    do {
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vmovdqa64_avx512f(auVar12);
      auVar12 = vporq_avx512f(auVar16,auVar13);
      auVar16 = vporq_avx512f(auVar16,auVar14);
      uVar4 = vpcmpuq_avx512f(auVar16,auVar15,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar12,auVar15,2);
      bVar6 = (byte)uVar4;
      uVar10 = CONCAT11(bVar6,bVar5);
      auVar12 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->d).d + uVar8));
      auVar16._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar12._4_4_;
      auVar16._0_4_ = (uint)(bVar5 & 1) * auVar12._0_4_;
      auVar16._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar12._8_4_;
      auVar16._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar12._12_4_;
      auVar16._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar12._16_4_;
      auVar16._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar12._20_4_;
      auVar16._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar12._24_4_;
      auVar16._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar12._28_4_;
      auVar16._32_4_ = (uint)(bVar6 & 1) * auVar12._32_4_;
      auVar16._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar12._36_4_;
      auVar16._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar12._40_4_;
      auVar16._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar12._44_4_;
      auVar16._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar12._48_4_;
      auVar16._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar12._52_4_;
      auVar16._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar12._56_4_;
      auVar16._60_4_ = (uint)(bVar6 >> 7) * auVar12._60_4_;
      uVar8 = uVar8 + 0x10;
      auVar12 = vpmulld_avx512f(auVar16,auVar17);
    } while ((uVar9 + 0xf & 0xfffffffffffffff0) != uVar8);
    auVar12 = vmovdqa32_avx512f(auVar12);
    auVar13._0_4_ = (uint)(bVar5 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar17._0_4_;
    bVar1 = (bool)((byte)(uVar10 >> 1) & 1);
    auVar13._4_4_ = (uint)bVar1 * auVar12._4_4_ | (uint)!bVar1 * auVar17._4_4_;
    bVar1 = (bool)((byte)(uVar10 >> 2) & 1);
    auVar13._8_4_ = (uint)bVar1 * auVar12._8_4_ | (uint)!bVar1 * auVar17._8_4_;
    bVar1 = (bool)((byte)(uVar10 >> 3) & 1);
    auVar13._12_4_ = (uint)bVar1 * auVar12._12_4_ | (uint)!bVar1 * auVar17._12_4_;
    bVar1 = (bool)((byte)(uVar10 >> 4) & 1);
    auVar13._16_4_ = (uint)bVar1 * auVar12._16_4_ | (uint)!bVar1 * auVar17._16_4_;
    bVar1 = (bool)((byte)(uVar10 >> 5) & 1);
    auVar13._20_4_ = (uint)bVar1 * auVar12._20_4_ | (uint)!bVar1 * auVar17._20_4_;
    bVar1 = (bool)((byte)(uVar10 >> 6) & 1);
    auVar13._24_4_ = (uint)bVar1 * auVar12._24_4_ | (uint)!bVar1 * auVar17._24_4_;
    bVar1 = (bool)((byte)(uVar10 >> 7) & 1);
    auVar13._28_4_ = (uint)bVar1 * auVar12._28_4_ | (uint)!bVar1 * auVar17._28_4_;
    auVar13._32_4_ = (uint)(bVar6 & 1) * auVar12._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar17._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar13._36_4_ = (uint)bVar1 * auVar12._36_4_ | (uint)!bVar1 * auVar17._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar13._40_4_ = (uint)bVar1 * auVar12._40_4_ | (uint)!bVar1 * auVar17._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar13._44_4_ = (uint)bVar1 * auVar12._44_4_ | (uint)!bVar1 * auVar17._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar13._48_4_ = (uint)bVar1 * auVar12._48_4_ | (uint)!bVar1 * auVar17._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar13._52_4_ = (uint)bVar1 * auVar12._52_4_ | (uint)!bVar1 * auVar17._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar13._56_4_ = (uint)bVar1 * auVar12._56_4_ | (uint)!bVar1 * auVar17._56_4_;
    auVar13._60_4_ =
         (uint)(bVar6 >> 7) * auVar12._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar17._60_4_;
    auVar11 = vextracti64x4_avx512f(auVar13,1);
    auVar12 = vpmulld_avx512f(auVar13,ZEXT3264(auVar11));
    auVar2 = vpmulld_avx(auVar12._0_16_,auVar12._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar18 = auVar2._0_4_;
  }
  uVar7 = iVar18 * (this->d).bd;
  if (uVar7 != 0) {
    uVar9 = (ulong)uVar7;
    t = this->v;
    do {
      boost::archive::save_access::save_primitive<boost::archive::text_oarchive,float>(ar,t);
      uVar9 = uVar9 - 1;
      t = t + 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    ar & d;
#if HAVE_CUDA
    float* vc = (float*)malloc(d.size() * sizeof(float));
    CUDA_CHECK(cudaMemcpy(vc, v, d.size() * sizeof(float), cudaMemcpyDeviceToHost));
    ar & boost::serialization::make_array(vc, d.size());
    free(vc);
#else
    ar & boost::serialization::make_array(v, d.size());
#endif
  }